

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O1

int CVodeSetLinearSolver(void *cvode_mem,SUNLinearSolver LS,SUNMatrix A)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  uint *__s;
  long lVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  uint local_34;
  
  if (cvode_mem == (void *)0x0) {
    pcVar7 = "Integrator memory is NULL.";
    iVar5 = -1;
    cvode_mem = (CVodeMem)0x0;
    iVar6 = -1;
    iVar3 = 0x8c;
LAB_00127532:
    cvProcessError((CVodeMem)cvode_mem,iVar6,iVar3,"CVodeSetLinearSolver",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                   ,pcVar7);
    return iVar5;
  }
  if (LS == (SUNLinearSolver)0x0) {
    pcVar7 = "LS must be non-NULL";
    iVar5 = -3;
    cvode_mem = (CVodeMem)0x0;
    iVar6 = -3;
    iVar3 = 0x92;
    goto LAB_00127532;
  }
  if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
     (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0)) {
    pcVar7 = "LS object is missing a required operation";
    iVar5 = -3;
    iVar6 = -3;
    iVar3 = 0x9b;
    goto LAB_00127532;
  }
  uVar2 = SUNLinSolGetType(LS);
  bVar8 = (uVar2 - 1 & 0xfffffffd) != 0;
  lVar4 = *(long *)(*(long *)((long)cvode_mem + 0x1d0) + 8);
  if ((*(long *)(lVar4 + 0x60) == 0) || (*(long *)(lVar4 + 0xa8) == 0)) {
    pcVar7 = "A required vector operation is not implemented.";
    iVar5 = -3;
    iVar6 = -3;
    iVar3 = 0xac;
    goto LAB_00127532;
  }
  if (A != (SUNMatrix)0x0 && uVar2 == 3) {
    pcVar7 = "Incompatible inputs: matrix-embedded LS requires NULL matrix";
    iVar5 = -3;
    iVar6 = -3;
    iVar3 = 0xb4;
    goto LAB_00127532;
  }
  if (uVar2 == 0) {
    if (A == (SUNMatrix)0x0) {
      pcVar7 = "Incompatible inputs: direct LS requires non-NULL matrix";
      iVar5 = -3;
      iVar6 = -3;
      iVar3 = 0xd4;
      goto LAB_00127532;
    }
  }
  else {
    if (*(long *)(lVar4 + 0x48) == 0) {
      pcVar7 = "A required vector operation is not implemented.";
      iVar5 = -3;
      iVar6 = -3;
      iVar3 = 0xbe;
      goto LAB_00127532;
    }
    if (((uVar2 != 3) != bVar8) &&
       (LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
      pcVar7 = "Incompatible inputs: iterative LS must support ATimes routine";
      iVar5 = -3;
      iVar6 = -3;
      iVar3 = 0xc6;
      goto LAB_00127532;
    }
    if ((A == (SUNMatrix)0x0) && ((uVar2 | 2) != 3)) {
      pcVar7 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
      iVar5 = -3;
      iVar6 = -3;
      iVar3 = 0xcd;
      goto LAB_00127532;
    }
  }
  if (*(code **)((long)cvode_mem + 0x7d8) != (code *)0x0) {
    (**(code **)((long)cvode_mem + 0x7d8))(cvode_mem);
  }
  *(code **)((long)cvode_mem + 0x7c0) = cvLsInitialize;
  *(code **)((long)cvode_mem + 0x7c8) = cvLsSetup;
  *(code **)((long)cvode_mem + 2000) = cvLsSolve;
  *(code **)((long)cvode_mem + 0x7d8) = cvLsFree;
  __s = (uint *)malloc(0x140);
  if (__s == (uint *)0x0) {
    pcVar7 = "A memory request failed.";
    iVar5 = -4;
    iVar6 = -4;
    iVar3 = 0xe7;
    goto LAB_00127532;
  }
  memset(__s,0,0x140);
  *(SUNLinearSolver *)(__s + 0x12) = LS;
  local_34 = (uint)(uVar2 != 0);
  *__s = local_34;
  __s[1] = (uint)bVar8;
  if (A == (SUNMatrix)0x0) {
    __s[2] = 0;
    __s[4] = 0;
    __s[5] = 0;
    __s[6] = 0;
    __s[7] = 0;
  }
  else {
    __s[2] = 1;
    *(code **)(__s + 4) = cvLsDQJac;
    *(void **)(__s + 6) = cvode_mem;
  }
  __s[0x3e] = 1;
  __s[0x40] = 0;
  __s[0x41] = 0;
  *(code **)(__s + 0x42) = cvLsDQJtimes;
  *(undefined8 *)(__s + 0x44) = *(undefined8 *)((long)cvode_mem + 0x10);
  *(void **)(__s + 0x46) = cvode_mem;
  __s[0x48] = 0;
  *(code **)(__s + 0x4a) = cvLsLinSys;
  *(void **)(__s + 0x4c) = cvode_mem;
  __s[0x36] = 0;
  __s[0x37] = 0;
  __s[0x38] = 0;
  __s[0x39] = 0;
  __s[0x3a] = 0;
  __s[0x3b] = 0;
  *(undefined8 *)(__s + 0x3c) = *(undefined8 *)((long)cvode_mem + 0x18);
  __s[0x22] = 0;
  __s[0x23] = 0;
  __s[0x24] = 0;
  __s[0x25] = 0;
  __s[0x26] = 0;
  __s[0x27] = 0;
  __s[0x28] = 0;
  __s[0x29] = 0;
  __s[0x2a] = 0;
  __s[0x2b] = 0;
  __s[0x2c] = 0;
  __s[0x2d] = 0;
  __s[0x2e] = 0;
  __s[0x2f] = 0;
  __s[0x30] = 0;
  __s[0x31] = 0;
  __s[0x32] = 0;
  __s[0x33] = 0;
  __s[0x20] = 0x33;
  __s[0x21] = 0;
  __s[8] = 1;
  __s[10] = 0x9999999a;
  __s[0xb] = 0x3fc99999;
  __s[0xe] = 0x9999999a;
  __s[0xf] = 0x3fa99999;
  __s[0x4e] = 0;
  if ((LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) ||
     (iVar3 = SUNLinSolSetATimes(LS,cvode_mem,cvLsATimes), iVar3 == 0)) {
    if ((LS->ops->setpreconditioner ==
         (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
       (iVar3 = SUNLinSolSetPreconditioner(LS,cvode_mem,0,0), iVar3 == 0)) {
      if (A != (SUNMatrix)0x0) {
        *(SUNMatrix *)(__s + 0x14) = A;
        __s[0x16] = 0;
        __s[0x17] = 0;
      }
      lVar4 = N_VClone(*(undefined8 *)((long)cvode_mem + 0x1d0));
      *(long *)(__s + 0x18) = lVar4;
      if (lVar4 != 0) {
        lVar4 = N_VClone(*(undefined8 *)((long)cvode_mem + 0x1d0));
        *(long *)(__s + 0x1a) = lVar4;
        if (lVar4 != 0) {
          if (uVar2 != 0) {
            lVar4 = N_VGetLength(*(undefined8 *)(__s + 0x18));
            if (lVar4 < 1) {
              dVar1 = 0.0;
            }
            else {
              lVar4 = N_VGetLength(*(undefined8 *)(__s + 0x18));
              dVar1 = (double)lVar4;
              if (dVar1 < 0.0) {
                dVar1 = sqrt(dVar1);
              }
              else {
                dVar1 = SQRT(dVar1);
              }
            }
            *(double *)(__s + 0x10) = dVar1;
          }
          if (((uVar2 | 2) == 3) || (uVar2 = 1, *(int *)((long)cvode_mem + 0x20) != 2)) {
            uVar2 = 0;
          }
          __s[0xc] = uVar2;
          *(uint **)((long)cvode_mem + 0x7e0) = __s;
          return 0;
        }
        iVar5 = -4;
        cvProcessError((CVodeMem)cvode_mem,-4,0x14d,"CVodeSetLinearSolver",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                       ,"A memory request failed.");
        N_VDestroy(*(undefined8 *)(__s + 0x18));
        goto LAB_0012794f;
      }
      pcVar7 = "A memory request failed.";
      iVar5 = -4;
      iVar6 = -4;
      iVar3 = 0x143;
    }
    else {
      pcVar7 = "Error in calling SUNLinSolSetPreconditioner";
      iVar5 = -9;
      iVar6 = -9;
      iVar3 = 0x130;
    }
  }
  else {
    pcVar7 = "Error in calling SUNLinSolSetATimes";
    iVar5 = -9;
    iVar6 = -9;
    iVar3 = 0x122;
  }
  cvProcessError((CVodeMem)cvode_mem,iVar6,iVar3,"CVodeSetLinearSolver",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                 ,pcVar7);
LAB_0012794f:
  free(__s);
  return iVar5;
}

Assistant:

int CVodeSetLinearSolver(void* cvode_mem, SUNLinearSolver LS, SUNMatrix A)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval, LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if either cvode_mem or LS inputs are NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_CVMEM_NULL);
    return (CVLS_MEM_NULL);
  }
  if (LS == NULL)
  {
    cvProcessError(NULL, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "LS must be non-NULL");
    return (CVLS_ILL_INPUT);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "LS object is missing a required operation");
    return (CVLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if ((cv_mem->cv_tempv->ops->nvconst == NULL) ||
      (cv_mem->cv_tempv->ops->nvwrmsnorm == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSG_LS_BAD_NVECTOR);
    return (CVLS_ILL_INPUT);
  }

  /* Ensure that A is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (A != NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                   __FILE__, "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return (CVLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if (cv_mem->cv_tempv->ops->nvgetlength == NULL)
    {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSG_LS_BAD_NVECTOR);
      return (CVLS_ILL_INPUT);
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL))
    {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                     __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (CVLS_ILL_INPUT);
    }

    if (matrixbased && (A == NULL))
    {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                     __FILE__, "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return (CVLS_ILL_INPUT);
    }
  }
  else if (A == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Incompatible inputs: direct LS requires non-NULL matrix");
    return (CVLS_ILL_INPUT);
  }

  /* free any existing system solver attached to CVode */
  if (cv_mem->cv_lfree) { cv_mem->cv_lfree(cv_mem); }

  /* Set four main system linear solver function fields in cv_mem */
  cv_mem->cv_linit  = cvLsInitialize;
  cv_mem->cv_lsetup = cvLsSetup;
  cv_mem->cv_lsolve = cvLsSolve;
  cv_mem->cv_lfree  = cvLsFree;

  /* Allocate memory for CVLsMemRec */
  cvls_mem = NULL;
  cvls_mem = (CVLsMem)malloc(sizeof(struct CVLsMemRec));
  if (cvls_mem == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  memset(cvls_mem, 0, sizeof(struct CVLsMemRec));

  /* set SUNLinearSolver pointer */
  cvls_mem->LS = LS;

  /* Linear solver type information */
  cvls_mem->iterative   = iterative;
  cvls_mem->matrixbased = matrixbased;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL)
  {
    cvls_mem->jacDQ  = SUNTRUE;
    cvls_mem->jac    = cvLsDQJac;
    cvls_mem->J_data = cv_mem;
  }
  else
  {
    cvls_mem->jacDQ  = SUNFALSE;
    cvls_mem->jac    = NULL;
    cvls_mem->J_data = NULL;
  }

  cvls_mem->jtimesDQ = SUNTRUE;
  cvls_mem->jtsetup  = NULL;
  cvls_mem->jtimes   = cvLsDQJtimes;
  cvls_mem->jt_f     = cv_mem->cv_f;
  cvls_mem->jt_data  = cv_mem;

  cvls_mem->user_linsys = SUNFALSE;
  cvls_mem->linsys      = cvLsLinSys;
  cvls_mem->A_data      = cv_mem;

  /* Set defaults for preconditioner-related fields */
  cvls_mem->pset   = NULL;
  cvls_mem->psolve = NULL;
  cvls_mem->pfree  = NULL;
  cvls_mem->P_data = cv_mem->cv_user_data;

  /* Initialize counters */
  cvLsInitializeCounters(cvls_mem);

  /* Set default values for the rest of the LS parameters */
  cvls_mem->msbj       = CVLS_MSBJ;
  cvls_mem->jbad       = SUNTRUE;
  cvls_mem->dgmax_jbad = CVLS_DGMAX;
  cvls_mem->eplifac    = CVLS_EPLIN;
  cvls_mem->last_flag  = CVLS_SUCCESS;

  /* If LS supports ATimes, attach CVLs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, cv_mem, cvLsATimes);
    if (retval != SUN_SUCCESS)
    {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                     "Error in calling SUNLinSolSetATimes");
      free(cvls_mem);
      cvls_mem = NULL;
      return (CVLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, cv_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                     "Error in calling SUNLinSolSetPreconditioner");
      free(cvls_mem);
      cvls_mem = NULL;
      return (CVLS_SUNLS_FAIL);
    }
  }

  /* When using a SUNMatrix object, store pointer to A and initialize savedJ */
  if (A != NULL)
  {
    cvls_mem->A      = A;
    cvls_mem->savedJ = NULL; /* allocated in cvLsInitialize */
  }

  /* Allocate memory for ytemp and x */
  cvls_mem->ytemp = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->ytemp == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    free(cvls_mem);
    cvls_mem = NULL;
    return (CVLS_MEM_FAIL);
  }

  cvls_mem->x = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->x == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    N_VDestroy(cvls_mem->ytemp);
    free(cvls_mem);
    cvls_mem = NULL;
    return (CVLS_MEM_FAIL);
  }

  /* For iterative LS, compute default norm conversion factor */
  if (iterative) { cvls_mem->nrmfac = SUNRsqrt(N_VGetLength(cvls_mem->ytemp)); }

  /* Check if solution scaling should be enabled */
  if (matrixbased && cv_mem->cv_lmm == CV_BDF) { cvls_mem->scalesol = SUNTRUE; }
  else { cvls_mem->scalesol = SUNFALSE; }

  /* Attach linear solver memory to integrator memory */
  cv_mem->cv_lmem = cvls_mem;

  return (CVLS_SUCCESS);
}